

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satTruth.c
# Opt level: O1

int Tru_ManInsert(Tru_Man_t *p,word *pTruth)

{
  Vec_Set_t *pVVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  word **ppwVar6;
  word *pwVar7;
  word wVar8;
  long lVar9;
  uint uVar10;
  size_t __size;
  int iVar11;
  
  lVar4 = (long)p->nWords;
  if (0 < lVar4) {
    lVar9 = 0;
    do {
      if (pTruth[lVar9] != 0) {
        if (p->nWords < 1) {
          return 1;
        }
        lVar9 = 0;
        while (pTruth[lVar9] == 0xffffffffffffffff) {
          lVar9 = lVar9 + 1;
          if (lVar4 == lVar9) {
            return 1;
          }
        }
        p->nTableLookups = p->nTableLookups + 1;
        if (p->nTableSize * 2 < p->pMem->nEntries) {
          Tru_ManResize(p);
        }
        uVar10 = (uint)*pTruth & 1;
        if ((uVar10 != 0) && (iVar2 = p->nWords, 0 < (long)iVar2)) {
          lVar4 = 0;
          do {
            pTruth[lVar4] = ~pTruth[lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar2 != lVar4);
        }
        puVar5 = (uint *)Tru_ManLookup(p,pTruth);
        if (*puVar5 == 0) {
          pVVar1 = p->pMem;
          iVar11 = p->nEntrySize + 1 >> 1;
          iVar2 = 1 << ((byte)pVVar1->nPageSize & 0x1f);
          if (iVar2 <= iVar11) {
            __assert_fail("nWords < (1 << p->nPageSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecSet.h"
                          ,0xd8,"int Vec_SetAppend(Vec_Set_t *, int *, int)");
          }
          pVVar1->nEntries = pVVar1->nEntries + 1;
          ppwVar6 = pVVar1->pPages;
          if (iVar2 <= (int)*ppwVar6[pVVar1->iPage] + iVar11) {
            iVar2 = pVVar1->iPage + 1;
            pVVar1->iPage = iVar2;
            if (iVar2 == pVVar1->nPagesAlloc) {
              __size = (long)pVVar1->nPagesAlloc << 4;
              if (ppwVar6 == (word **)0x0) {
                ppwVar6 = (word **)malloc(__size);
              }
              else {
                ppwVar6 = (word **)realloc(ppwVar6,__size);
              }
              pVVar1->pPages = ppwVar6;
              iVar2 = pVVar1->nPagesAlloc;
              memset(ppwVar6 + iVar2,0,(long)iVar2 << 3);
              pVVar1->nPagesAlloc = iVar2 * 2;
            }
            ppwVar6 = pVVar1->pPages;
            iVar2 = pVVar1->iPage;
            if (ppwVar6[iVar2] == (word *)0x0) {
              pwVar7 = (word *)malloc((long)(1 << ((byte)pVVar1->nPageSize & 0x1f)) << 3);
              ppwVar6[iVar2] = pwVar7;
            }
            pwVar7 = pVVar1->pPages[iVar2];
            *pwVar7 = 2;
            pwVar7[1] = 0xffffffffffffffff;
          }
          iVar2 = pVVar1->iPage;
          wVar8 = (long)iVar11 + *pVVar1->pPages[iVar2];
          *pVVar1->pPages[iVar2] = wVar8;
          uVar3 = ((int)wVar8 - iVar11) + (iVar2 << ((byte)pVVar1->nPageSize & 0x1f));
          *puVar5 = uVar3;
          if ((uVar3 & 1) != 0) {
            __assert_fail("(*pSpot & 1) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satTruth.c"
                          ,0xb0,"int Tru_ManInsert(Tru_Man_t *, word *)");
          }
          if (uVar3 == 0) {
            pwVar7 = (word *)0x0;
          }
          else {
            pVVar1 = p->pMem;
            pwVar7 = pVVar1->pPages[(int)uVar3 >> ((byte)pVVar1->nPageSize & 0x1f)] +
                     (int)(pVVar1->uPageMask & uVar3);
          }
          iVar2 = p->nWords;
          if (0 < (long)iVar2) {
            lVar4 = 0;
            do {
              pwVar7[lVar4 + 1] = pTruth[lVar4];
              lVar4 = lVar4 + 1;
            } while (iVar2 != lVar4);
          }
          *(uint *)pwVar7 = uVar3;
          *(uint *)((long)pwVar7 + 4) = 0;
        }
        if ((uVar10 != 0) && (iVar2 = p->nWords, 0 < (long)iVar2)) {
          lVar4 = 0;
          do {
            pTruth[lVar4] = ~pTruth[lVar4];
            lVar4 = lVar4 + 1;
          } while (iVar2 != lVar4);
        }
        return uVar10 ^ *puVar5;
      }
      lVar9 = lVar9 + 1;
    } while (lVar4 != lVar9);
  }
  return 0;
}

Assistant:

int Tru_ManInsert( Tru_Man_t * p, word * pTruth )
{
    int fCompl, * pSpot;
    if ( Tru_ManEqual0(pTruth, p->nWords) )
        return 0;
    if ( Tru_ManEqual1(pTruth, p->nWords) )
        return 1;
    p->nTableLookups++;
    if ( Vec_SetEntryNum(p->pMem) > 2 * p->nTableSize )
        Tru_ManResize( p );
    fCompl = pTruth[0] & 1;
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    pSpot = Tru_ManLookup( p, pTruth );
    if ( *pSpot == 0 )
    {
        Tru_One_t * pEntry;
        *pSpot = Vec_SetAppend( p->pMem, NULL, p->nEntrySize );
        assert( (*pSpot & 1) == 0 );
        pEntry = Tru_ManReadOne( p, *pSpot );
        Tru_ManCopy( pEntry->pTruth, pTruth, p->nWords );
        pEntry->Handle = *pSpot;
        pEntry->Next = 0;
    }
    if ( fCompl )  
        Tru_ManNot( pTruth, p->nWords );
    return *pSpot ^ fCompl;
}